

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O0

uint64_t aom_var_2d_u8_c(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  uint8_t v;
  uint64_t s;
  uint64_t ss;
  int c;
  int r;
  int height_local;
  int width_local;
  int src_stride_local;
  uint8_t *src_local;
  
  ss = 0;
  s = 0;
  src_local = src;
  for (r = 0; r < height; r = r + 1) {
    for (c = 0; c < width; c = c + 1) {
      bVar1 = src_local[c];
      ss = (long)(int)((uint)bVar1 * (uint)bVar1) + ss;
      s = bVar1 + s;
    }
    src_local = src_local + src_stride;
  }
  return ss - (s * s) / (ulong)(long)(width * height);
}

Assistant:

uint64_t aom_var_2d_u8_c(uint8_t *src, int src_stride, int width, int height) {
  int r, c;
  uint64_t ss = 0, s = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const uint8_t v = src[c];
      ss += v * v;
      s += v;
    }
    src += src_stride;
  }

  return (ss - s * s / (width * height));
}